

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::StringItoAMethod::~StringItoAMethod(StringItoAMethod *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

StringItoAMethod(const Builtins& builtins, KnownSystemName knownNameId, LiteralBase base) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 1, {&builtins.integerType},
                               builtins.voidType, true, /* isFirstArgLValue */ true),
        base(base) {}